

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tribench.c
# Opt level: O3

void attoAppInit(AAppProctable *proctable)

{
  undefined8 *puVar1;
  float *pfVar2;
  undefined8 *puVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  AGLProgram AVar12;
  AGLProgram AVar13;
  TriVertex *pTVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 in_XMM1_Db;
  undefined4 uVar21;
  undefined4 in_XMM1_Dd;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  AVec3f AVar26;
  AVec3f AVar27;
  char *vvertex [2];
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ALCGRand local_a8;
  undefined8 uStack_a0;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  char *local_48;
  undefined8 uStack_40;
  
  aGLInit();
  local_a8.state_ = 0x4000;
  g.vertices_count = 0x18000;
  g.vertices = (TriVertex *)malloc(0x480000);
  lVar18 = 0;
  do {
    pTVar14 = g.vertices;
    uVar21 = 0;
    AVar26 = randomVector(&local_a8,1.0);
    local_98 = AVar26.z;
    *(long *)((long)&pTVar14[2].tricenter.x + lVar18) = AVar26._0_8_;
    *(float *)((long)&pTVar14[2].tricenter.z + lVar18) = local_98;
    uVar5 = *(undefined8 *)((long)&pTVar14[2].tricenter.x + lVar18);
    *(undefined8 *)((long)&pTVar14[1].tricenter.x + lVar18) = uVar5;
    uVar15 = *(undefined4 *)((long)&pTVar14[2].tricenter.z + lVar18);
    *(undefined4 *)((long)&pTVar14[1].tricenter.z + lVar18) = uVar15;
    *(undefined8 *)((long)&(pTVar14->tricenter).x + lVar18) = uVar5;
    *(undefined4 *)((long)&(pTVar14->tricenter).z + lVar18) = uVar15;
    uStack_94 = in_XMM1_Db;
    uStack_90 = uVar21;
    uStack_8c = in_XMM1_Dd;
    AVar27 = randomVector(&local_a8,0.1);
    local_78 = AVar27.z;
    uStack_70 = 0;
    local_b8 = AVar26.x;
    fStack_b4 = AVar26.y;
    fStack_b0 = (float)extraout_XMM0_Qb;
    fStack_ac = (float)((ulong)extraout_XMM0_Qb >> 0x20);
    local_58 = AVar27.x + local_b8;
    fStack_54 = AVar27.y + fStack_b4;
    fStack_50 = (float)extraout_XMM0_Qb_00 + fStack_b0;
    fStack_4c = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20) + fStack_ac;
    pfVar2 = (float *)((long)&(pTVar14->pos).x + lVar18);
    *pfVar2 = local_58;
    pfVar2[1] = fStack_54;
    uStack_74 = in_XMM1_Db;
    uStack_6c = in_XMM1_Dd;
    AVar26 = randomVector(&local_a8,0.1);
    local_88 = AVar26.x + local_b8;
    fStack_84 = AVar26.y + fStack_b4;
    fStack_80 = (float)extraout_XMM0_Qb_01 + fStack_b0;
    fStack_7c = (float)((ulong)extraout_XMM0_Qb_01 >> 0x20) + fStack_ac;
    local_68 = AVar26.z + local_98;
    uStack_60 = 0;
    pfVar2 = (float *)((long)&pTVar14[1].pos.x + lVar18);
    *pfVar2 = local_88;
    pfVar2[1] = fStack_84;
    *(float *)((long)&pTVar14[1].pos.z + lVar18) = local_68;
    uStack_64 = in_XMM1_Db;
    uStack_5c = in_XMM1_Dd;
    AVar26 = randomVector(&local_a8,0.1);
    local_b8 = AVar26.x + local_b8;
    fStack_b4 = AVar26.y + fStack_b4;
    *(ulong *)((long)&pTVar14[2].pos.x + lVar18) = CONCAT44(fStack_b4,local_b8);
    fVar24 = AVar26.z + local_98;
    *(float *)((long)&(pTVar14->pos).z + lVar18) = local_78 + local_98;
    *(float *)((long)&pTVar14[2].pos.z + lVar18) = fVar24;
    local_b8 = local_b8 - local_88;
    fStack_b4 = fStack_b4 - fStack_84;
    fVar22 = (local_78 + local_98) - local_68;
    fVar24 = fVar24 - local_68;
    fVar23 = fVar22 * local_b8 - fVar24 * (local_58 - local_88);
    fVar25 = fVar24 * (fStack_54 - fStack_84) - fVar22 * fStack_b4;
    fVar22 = fStack_b4 * (local_58 - local_88) - (fStack_54 - fStack_84) * local_b8;
    fVar24 = 1.0 / SQRT(fVar22 * fVar22 + fVar25 * fVar25 + fVar23 * fVar23);
    *(ulong *)((long)&pTVar14[2].normal.x + lVar18) = CONCAT44(fVar23 * fVar24,fVar25 * fVar24);
    *(float *)((long)&pTVar14[2].normal.z + lVar18) = fVar22 * fVar24;
    uVar15 = *(undefined4 *)((long)&pTVar14[2].normal.z + lVar18);
    *(undefined4 *)((long)&pTVar14[1].normal.z + lVar18) = uVar15;
    uVar5 = *(undefined8 *)((long)&pTVar14[2].normal.x + lVar18);
    *(undefined8 *)((long)&pTVar14[1].normal.x + lVar18) = uVar5;
    *(undefined4 *)((long)&(pTVar14->normal).z + lVar18) = uVar15;
    *(undefined8 *)((long)&(pTVar14->normal).x + lVar18) = uVar5;
    lVar16 = local_a8.state_ * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    lVar17 = lVar16 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    auVar19._0_4_ = (undefined4)((ulong)lVar16 >> 0x18);
    auVar19._8_4_ = (undefined4)((ulong)lVar17 >> 0x18);
    auVar19._4_4_ = auVar19._8_4_;
    auVar19[0xc] = (char)((ulong)lVar17 >> 0x38);
    auVar19._13_3_ = 0;
    auVar19 = auVar19 & _DAT_00107040;
    auVar20._0_4_ = (float)auVar19._0_4_;
    auVar20._4_4_ = (float)auVar19._4_4_;
    auVar20._8_4_ = (float)auVar19._8_4_;
    auVar20._12_4_ = (float)auVar19._12_4_;
    auVar19 = divps(auVar20,_DAT_00107050);
    local_a8.state_ = lVar17 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    *(long *)((long)&pTVar14[2].color.x + lVar18) = auVar19._0_8_;
    *(float *)((long)&pTVar14[2].color.z + lVar18) =
         (float)((uint)(local_a8.state_ >> 0x18) & 0xffffff) / 16777215.0;
    uVar5 = *(undefined8 *)((long)&pTVar14[2].color.x + lVar18);
    *(undefined8 *)((long)&pTVar14[1].color.x + lVar18) = uVar5;
    uVar15 = *(undefined4 *)((long)&pTVar14[2].color.z + lVar18);
    *(undefined4 *)((long)&pTVar14[1].color.z + lVar18) = uVar15;
    *(undefined8 *)((long)&(pTVar14->color).x + lVar18) = uVar5;
    *(undefined4 *)((long)&(pTVar14->color).z + lVar18) = uVar15;
    puVar3 = (undefined8 *)((long)&(pTVar14->pos).x + lVar18);
    uVar5 = puVar3[1];
    puVar1 = (undefined8 *)((long)&(pTVar14->tricenter).y + lVar18);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pTVar14[2].pos.x + lVar18);
    uVar8 = *puVar1;
    uVar9 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pTVar14[2].tricenter.y + lVar18);
    uVar10 = *puVar1;
    uVar11 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pTVar14[3].pos.x + lVar18);
    *puVar1 = *puVar3;
    puVar1[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pTVar14[3].tricenter.y + lVar18);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    puVar1 = (undefined8 *)((long)&(pTVar14->normal).z + lVar18);
    uVar5 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar14[3].normal.z + lVar18);
    *puVar3 = *puVar1;
    puVar3[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pTVar14[4].pos.x + lVar18);
    *puVar1 = uVar8;
    puVar1[1] = uVar9;
    puVar1 = (undefined8 *)((long)&pTVar14[4].tricenter.y + lVar18);
    *puVar1 = uVar10;
    puVar1[1] = uVar11;
    puVar1 = (undefined8 *)((long)&pTVar14[2].normal.z + lVar18);
    uVar5 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar14[4].normal.z + lVar18);
    *puVar3 = *puVar1;
    puVar3[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pTVar14[1].tricenter.y + lVar18);
    uVar5 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar14[5].tricenter.y + lVar18);
    *puVar3 = *puVar1;
    puVar3[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pTVar14[1].normal.z + lVar18);
    uVar5 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar14[5].normal.z + lVar18);
    *puVar3 = *puVar1;
    puVar3[1] = uVar5;
    puVar1 = (undefined8 *)((long)&pTVar14[1].pos.x + lVar18);
    uVar5 = puVar1[1];
    puVar3 = (undefined8 *)((long)&pTVar14[5].pos.x + lVar18);
    *puVar3 = *puVar1;
    puVar3[1] = uVar5;
    in_XMM1_Db = 0x80000000;
    in_XMM1_Dd = 0x80000000;
    uVar4 = *(uint *)((long)&(pTVar14->normal).z + lVar18);
    *(ulong *)((long)&pTVar14[5].normal.x + lVar18) =
         *(ulong *)((long)&(pTVar14->normal).x + lVar18) ^ 0x8000000080000000;
    *(uint *)((long)&pTVar14[5].normal.z + lVar18) = uVar4 ^ 0x80000000;
    uVar5 = *(undefined8 *)((long)&pTVar14[5].normal.x + lVar18);
    *(undefined8 *)((long)&pTVar14[4].normal.x + lVar18) = uVar5;
    uVar15 = *(undefined4 *)((long)&pTVar14[5].normal.z + lVar18);
    *(undefined4 *)((long)&pTVar14[4].normal.z + lVar18) = uVar15;
    *(undefined8 *)((long)&pTVar14[3].normal.x + lVar18) = uVar5;
    *(undefined4 *)((long)&pTVar14[3].normal.z + lVar18) = uVar15;
    lVar18 = lVar18 + 0x120;
  } while (lVar18 != 0x480000);
  uStack_a0 = 0;
  uStack_40 = 0;
  local_a8.state_ = 0x107150;
  local_48 = "varying vec3 vv3_color;\nvoid main() {\n  gl_FragColor = vec4(vv3_color, 1.);\n}";
  g.draw.program = aGLProgramCreate((char **)&local_a8,&local_48);
  if (g.draw.program < 1) {
    aAppDebugPrintf("shader error: %s",a_gl_error);
  }
  AVar12 = g.draw.program;
  g.attr[0].name = "av3_pos";
  g.attr[0].buffer = (AGLBuffer *)0x0;
  g.attr[0].size = 3;
  g.attr[0].type = 0x1406;
  g.attr[0].normalized = '\0';
  g.attr[0].stride = 0x30;
  g.attr[0].ptr = g.vertices;
  g.attr[2].name = "av3_normal";
  g.attr[2].buffer = (AGLBuffer *)0x0;
  g.attr[2].size = 3;
  g.attr[2].type = 0x1406;
  g.attr[2].normalized = '\0';
  g.attr[2].stride = 0x30;
  g.attr[2].ptr = &(g.vertices)->normal;
  g.attr[1].name = "av3_tricenter";
  g.attr[1].buffer = (AGLBuffer *)0x0;
  g.attr[1].size = 3;
  g.attr[1].type = 0x1406;
  g.attr[1].normalized = '\0';
  g.attr[1].stride = 0x30;
  g.attr[1].ptr = &(g.vertices)->tricenter;
  g.attr[3].name = "av3_color";
  g.attr[3].buffer = (AGLBuffer *)0x0;
  g.attr[3].size = 3;
  g.attr[3].type = 0x1406;
  g.attr[3].normalized = '\0';
  g.attr[3].stride = 0x30;
  g.attr[3].ptr = &(g.vertices)->color;
  g.pun[0].name = "um4_vp";
  g.pun[0].type = AGLAT_Mat4;
  g.pun[0].count = 1;
  g.pun[1].name = "um4_model";
  g.pun[1].type = AGLAT_Mat4;
  g.pun[1].count = 1;
  g.pun[2].name = "uv3_lightpos";
  g.pun[2].type = AGLAT_Vec3;
  g.pun[2].count = 1;
  g.draw.primitive.mode = 4;
  g.draw.primitive.count = g.vertices_count;
  g.draw.primitive.first = 0;
  g.draw.primitive.index.data.ptr = (GLvoid *)0x0;
  g.draw.primitive.index.buffer = (AGLBuffer *)0x0;
  g.draw.primitive.cull_mode = AGLCM_Front;
  g.draw.primitive.front_face = AGLFF_CounterClockwise;
  g.draw.attribs.p = g.attr;
  g.draw.attribs.n = 4;
  lVar18 = 0x28;
  do {
    uVar15 = glGetAttribLocation(AVar12,*(undefined8 *)(a_gl_error + lVar18 + 0x3d8));
    *(undefined4 *)((long)&g.attr[0].name + lVar18) = uVar15;
    AVar13 = g.draw.program;
    lVar18 = lVar18 + 0x30;
  } while (lVar18 != 0xe8);
  g.draw.uniforms.p = g.pun;
  g.draw.uniforms.n = 3;
  lVar18 = 0;
  do {
    uVar15 = glGetUniformLocation(AVar13,*(undefined8 *)((long)&g.pun[0].name + lVar18));
    *(undefined4 *)((long)&g.pun[0]._.location + lVar18) = uVar15;
    lVar18 = lVar18 + 0x20;
  } while (lVar18 != 0x60);
  g.merge.blend.enable = 0;
  g.merge.depth.mode = AGLDM_TestAndWrite;
  g.merge.depth.func = AGLDF_Less;
  proctable->resize = resize;
  proctable->paint = paint;
  proctable->key = keyPress;
  return;
}

Assistant:

void attoAppInit(struct AAppProctable *proctable) {
	aGLInit();
	init();

	proctable->resize = resize;
	proctable->paint = paint;
	proctable->key = keyPress;
}